

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O0

aiVectorKey * __thiscall
Assimp::B3DImporter::to_array<aiVectorKey>
          (B3DImporter *this,vector<aiVectorKey,_std::allocator<aiVectorKey>_> *v)

{
  undefined1 auVar1 [16];
  float fVar2;
  bool bVar3;
  size_type sVar4;
  ulong uVar5;
  const_reference pvVar6;
  _func_int ***ppp_Var7;
  B3DImporter *local_48;
  ulong local_30;
  size_t i;
  aiVectorKey *p;
  vector<aiVectorKey,_std::allocator<aiVectorKey>_> *v_local;
  B3DImporter *this_local;
  
  bVar3 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::empty(v);
  if (bVar3) {
    this_local = (B3DImporter *)0x0;
  }
  else {
    sVar4 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::size(v);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = sVar4;
    uVar5 = SUB168(auVar1 * ZEXT816(0x18),0);
    if (SUB168(auVar1 * ZEXT816(0x18),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    this_local = (B3DImporter *)operator_new__(uVar5);
    if (sVar4 != 0) {
      local_48 = this_local;
      do {
        aiVectorKey::aiVectorKey((aiVectorKey *)local_48);
        local_48 = (B3DImporter *)
                   &(local_48->super_BaseImporter).importerUnits._M_t._M_impl.super__Rb_tree_header.
                    _M_header._M_parent;
      } while (local_48 !=
               (B3DImporter *)(&(this_local->super_BaseImporter)._vptr_BaseImporter + sVar4 * 3));
    }
    for (local_30 = 0; sVar4 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::size(v),
        local_30 < sVar4; local_30 = local_30 + 1) {
      pvVar6 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::operator[](v,local_30);
      ppp_Var7 = &(this_local->super_BaseImporter)._vptr_BaseImporter + local_30 * 3;
      *ppp_Var7 = (_func_int **)pvVar6->mTime;
      fVar2 = (pvVar6->mValue).y;
      *(float *)&(((map<Assimp::BaseImporter::ImporterUnits,_double,_std::less<Assimp::BaseImporter::ImporterUnits>,_std::allocator<std::pair<const_Assimp::BaseImporter::ImporterUnits,_double>_>_>
                    *)(ppp_Var7 + 1))->_M_t)._M_impl.field_0x0 = (pvVar6->mValue).x;
      *(float *)&(((map<Assimp::BaseImporter::ImporterUnits,_double,_std::less<Assimp::BaseImporter::ImporterUnits>,_std::allocator<std::pair<const_Assimp::BaseImporter::ImporterUnits,_double>_>_>
                    *)(ppp_Var7 + 1))->_M_t)._M_impl.field_0x4 = fVar2;
      (((_Rb_tree_header *)(ppp_Var7 + 2))->_M_header)._M_color = (_Rb_tree_color)(pvVar6->mValue).z
      ;
    }
  }
  return (aiVectorKey *)this_local;
}

Assistant:

T *B3DImporter::to_array( const vector<T> &v ){
    if( v.empty() ) {
        return 0;
    }
    T *p=new T[ v.size() ];
    for( size_t i=0;i<v.size();++i ){
        p[i]=v[i];
    }
    return p;
}